

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O0

void __thiscall
glslang::TParseVersions::ppRequireExtensions
          (TParseVersions *this,TSourceLoc *loc,int numExtensions,char **extensions,
          char *featureDesc)

{
  uint uVar1;
  int local_34;
  int i;
  char *featureDesc_local;
  char **extensions_local;
  int numExtensions_local;
  TSourceLoc *loc_local;
  TParseVersions *this_local;
  
  uVar1 = (*this->_vptr_TParseVersions[0xc])
                    (this,loc,(ulong)(uint)numExtensions,extensions,featureDesc);
  if ((uVar1 & 1) == 0) {
    if (numExtensions == 1) {
      (*this->_vptr_TParseVersions[0x2f])
                (this,loc,"required extension not requested:",featureDesc,*extensions);
    }
    else {
      (*this->_vptr_TParseVersions[0x2f])
                (this,loc,"required extension not requested:",featureDesc,
                 "Possible extensions include:");
      for (local_34 = 0; local_34 < numExtensions; local_34 = local_34 + 1) {
        TInfoSinkBase::message(&this->infoSink->info,EPrefixNone,extensions[local_34]);
      }
    }
  }
  return;
}

Assistant:

void TParseVersions::ppRequireExtensions(const TSourceLoc& loc, int numExtensions, const char* const extensions[],
    const char* featureDesc)
{
    if (checkExtensionsRequested(loc, numExtensions, extensions, featureDesc))
        return;

    // If we get this far, give errors explaining what extensions are needed
    if (numExtensions == 1)
        ppError(loc, "required extension not requested:", featureDesc, extensions[0]);
    else {
        ppError(loc, "required extension not requested:", featureDesc, "Possible extensions include:");
        for (int i = 0; i < numExtensions; ++i)
            infoSink.info.message(EPrefixNone, extensions[i]);
    }
}